

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_block.cpp
# Opt level: O2

void msd_D<1024u>(uchar **strings,size_t n,size_t depth)

{
  Block ppuVar1;
  Block __dest;
  byte bVar2;
  ulong uVar3;
  size_t n_00;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  _List_node_base **__x;
  pointer ppppuVar8;
  uint j;
  int iVar9;
  Block ppuVar10;
  long lVar11;
  uint i;
  long lVar12;
  ulong uVar13;
  unsigned_long uVar14;
  FreeBlocks *fb;
  Buckets *this;
  ulong uVar15;
  size_t i_1;
  ulong uVar16;
  _List_node_base *p_Var17;
  ulong uVar18;
  uchar **ppuVar19;
  BackLinks backlinks;
  Block b;
  uchar cache [32];
  array<unsigned_long,_256UL> bucketsize;
  
  if (n < 0x10000) {
    msd_CE2_16bit(strings,n,depth);
    return;
  }
  if ((msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                   buckets_abi_cxx11_), iVar9 != 0)) {
    std::array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>::
    array(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_);
    __cxa_atexit(std::
                 array<std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>,_256UL>
                 ::~array,&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                           buckets_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                         buckets_abi_cxx11_);
  }
  if ((msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_ == '\0') &&
     (iVar9 = __cxa_guard_acquire(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                                   freeblocks_abi_cxx11_), iVar9 != 0)) {
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
    super__List_node_base._M_prev =
         (_List_node_base *)
         &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
    super__List_node_base._M_next =
         (_List_node_base *)
         &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
    msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_.
    super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node._M_size =
         0;
    __cxa_atexit(std::__cxx11::_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>::
                 ~_List_base,
                 &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_,
                 &__dso_handle);
    __cxa_guard_release(&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                         freeblocks_abi_cxx11_);
  }
  std::vector<unsigned_char_***,_std::allocator<unsigned_char_***>_>::vector
            (&backlinks,(n >> 10) + 1,(allocator_type *)&bucketsize);
  this = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_;
  for (lVar12 = 0; lVar12 != 0x100; lVar12 = lVar12 + 1) {
    bucketsize._M_elems[lVar12] = 0;
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear(this->_M_elems);
    this = (Buckets *)((long)this + 0x18);
  }
  for (lVar12 = 0; lVar12 != 0x20c000; lVar12 = lVar12 + 0x2000) {
    cache._0_8_ = (long)msd_D<1024U>::temp_space._M_elems + lVar12;
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
              (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_,
               (value_type *)cache);
  }
  ppuVar19 = strings;
  for (uVar16 = 0; uVar16 < n - 0x400; uVar16 = uVar16 + 0x400) {
    cache._0_8_ = ppuVar19;
    std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
              (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_,
               (value_type *)cache);
    ppuVar19 = ppuVar19 + 0x400;
  }
  ppuVar1 = strings + n;
  fb = (FreeBlocks *)strings;
  for (uVar16 = 0; uVar16 < (n & 0xffffffffffffffe0); uVar16 = uVar16 + 0x20) {
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      cache[lVar12] =
           *(uchar *)((long)&(&(fb->
                               super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>
                               )._M_impl._M_node.super__List_node_base._M_next)[lVar12]->_M_next +
                     depth);
    }
    for (lVar12 = 0; lVar12 != 0x20; lVar12 = lVar12 + 1) {
      bVar2 = cache[lVar12];
      uVar3 = bucketsize._M_elems[bVar2];
      uVar13 = uVar3 & 0x3ff;
      if (uVar13 == 0) {
        b = take_free_block(fb);
        std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                  (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                   _M_elems + bVar2,&b);
        if (b < ppuVar1 && strings <= b) {
          auVar4._8_8_ = (long)b - (long)strings >> 0x3f;
          auVar4._0_8_ = (long)b - (long)strings >> 3;
          backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_start[SUB168(auVar4 / SEXT816(0x400),0)] =
               (uchar ***)
               (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                _M_elems[bVar2].
                super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
                _M_node.super__List_node_base._M_prev + 1);
        }
      }
      if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
          [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          _M_node.super__List_node_base._M_next ==
          (_List_node_base *)
          (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems +
          bVar2)) {
        __assert_fail("not buckets[c].empty()",
                      "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                      ,0x7a,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
      }
      (&(msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
         [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
         _M_node.super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar13] =
           (&(fb->super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>)._M_impl.
             _M_node.super__List_node_base._M_next)[lVar12];
      bucketsize._M_elems[bVar2] = uVar3 + 1;
    }
    fb = (FreeBlocks *)
         &fb[10].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
          _M_node._M_size;
  }
  for (; uVar16 < n; uVar16 = uVar16 + 1) {
    bVar2 = strings[uVar16][depth];
    uVar3 = bucketsize._M_elems[bVar2];
    uVar13 = uVar3 & 0x3ff;
    if (uVar13 == 0) {
      cache._0_8_ = take_free_block(fb);
      fb = msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems +
           bVar2;
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                (fb,(value_type *)cache);
      if ((ulong)cache._0_8_ < ppuVar1 && strings <= (ulong)cache._0_8_) {
        auVar5._8_8_ = cache._0_8_ - (long)strings >> 0x3f;
        auVar5._0_8_ = cache._0_8_ - (long)strings >> 3;
        backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
        super__Vector_impl_data._M_start[SUB168(auVar5 / SEXT816(0x400),0)] =
             (uchar ***)
             (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
              [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
              _M_node.super__List_node_base._M_prev + 1);
      }
    }
    if (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems
        [bVar2].super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl.
        _M_node.super__List_node_base._M_next ==
        (_List_node_base *)
        (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems +
        bVar2)) {
      __assert_fail("not buckets[c].empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                    ,0x88,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
    }
    (&(msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_._M_elems[bVar2]
       .super__List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_>._M_impl._M_node.
       super__List_node_base._M_prev[1]._M_next)->_M_next)[uVar13] =
         (_List_node_base *)strings[uVar16];
    bucketsize._M_elems[bVar2] = uVar3 + 1;
  }
  lVar12 = 0;
  uVar16 = 0;
  do {
    if (lVar12 == 0x100) {
      std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::clear
                (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_);
      if (backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
        super__Vector_impl_data._M_finish =
             backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
             _M_impl.super__Vector_impl_data._M_start;
      }
      uVar14 = bucketsize._M_elems[0];
      for (lVar12 = 1; lVar12 != 0x100; lVar12 = lVar12 + 1) {
        n_00 = bucketsize._M_elems[lVar12];
        if (n_00 != 0) {
          msd_D<1024u>(strings + uVar14,n_00,depth + 1);
          uVar14 = uVar14 + n_00;
        }
      }
      std::_Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>::~_Vector_base
                (&backlinks.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>);
      return;
    }
    uVar3 = bucketsize._M_elems[lVar12];
    if (uVar3 != 0) {
      p_Var17 = (_List_node_base *)
                (msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::buckets_abi_cxx11_.
                 _M_elems + lVar12);
      for (uVar13 = 0; uVar15 = uVar3 - uVar13, uVar13 <= uVar3 && uVar15 != 0;
          uVar13 = uVar13 + 0x400) {
        if (0x3ff < uVar15) {
          uVar15 = 0x400;
        }
        p_Var17 = (((_List_base<unsigned_char_**,_std::allocator<unsigned_char_**>_> *)
                   &p_Var17->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
        ppuVar10 = *(Block *)(p_Var17 + 1);
        __dest = strings + uVar16;
        if (ppuVar10 == __dest) {
          if ((uVar16 & 0x3ff) != 0) {
            __assert_fail("pos%B==0",
                          "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                          ,0x9b,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
          }
          *(undefined8 *)
           ((long)backlinks.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
                  super__Vector_impl_data._M_start + (uVar16 >> 7)) = 0;
        }
        else {
          uVar18 = (uVar15 + uVar16) - 1 >> 10;
          __x = &p_Var17[1]._M_next;
          if (backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[uVar18] != (uchar ***)0x0) {
            do {
              ppuVar10 = take_free_block(fb);
              ppppuVar8 = backlinks.
                          super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
                          _M_impl.super__Vector_impl_data._M_start;
              if (ppuVar10 < strings) break;
            } while (ppuVar10 < __dest);
            if (ppuVar10 < ppuVar1 && strings <= ppuVar10) {
              auVar6._8_8_ = (long)ppuVar10 - (long)strings >> 0x3f;
              auVar6._0_8_ = (long)ppuVar10 - (long)strings >> 3;
              lVar11 = SUB168(auVar6 / SEXT816(0x400),0);
              if (backlinks.
                  super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl.
                  super__Vector_impl_data._M_start[lVar11] != (uchar ***)0x0) {
                __assert_fail("backlinks[(tmp-strings)/B]==0",
                              "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                              ,0xac,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
              }
              backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
              _M_impl.super__Vector_impl_data._M_start[lVar11] =
                   backlinks.
                   super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>._M_impl
                   .super__Vector_impl_data._M_start[uVar18];
            }
            memcpy(ppuVar10,*backlinks.
                             super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>
                             ._M_impl.super__Vector_impl_data._M_start[uVar18],0x2000);
            *ppppuVar8[uVar18] = ppuVar10;
            backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[uVar18] = (uchar ***)0x0;
            ppuVar10 = (Block)*__x;
          }
          if (ppuVar10 < ppuVar1 && strings <= ppuVar10) {
            if (ppuVar10 <= __dest) {
              __assert_fail("*it > strings+pos",
                            "/workspace/llm4binary/github/license_c_cmakelists/rantala[P]string-sorting/src/msd_dyn_block.cpp"
                            ,0xb5,"void msd_D(unsigned char **, size_t, size_t) [B = 1024U]");
            }
            auVar7._8_8_ = (long)ppuVar10 - (long)strings >> 0x3f;
            auVar7._0_8_ = (long)ppuVar10 - (long)strings >> 3;
            backlinks.super__Vector_base<unsigned_char_***,_std::allocator<unsigned_char_***>_>.
            _M_impl.super__Vector_impl_data._M_start[SUB168(auVar7 / SEXT816(0x400),0)] =
                 (uchar ***)0x0;
            ppuVar10 = (Block)*__x;
          }
          memcpy(__dest,ppuVar10,uVar15 * 8);
          if (*__x < ppuVar1 && strings <= *__x) {
            fb = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
            std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_back
                      (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                        freeblocks_abi_cxx11_,(value_type *)__x);
          }
          else {
            fb = &msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::freeblocks_abi_cxx11_;
            std::__cxx11::list<unsigned_char_**,_std::allocator<unsigned_char_**>_>::push_front
                      (&msd_D<1024u>(unsigned_char**,unsigned_long,unsigned_long)::
                        freeblocks_abi_cxx11_,(value_type *)__x);
          }
        }
        uVar16 = uVar16 + uVar15;
      }
    }
    lVar12 = lVar12 + 1;
  } while( true );
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth)
{
	if (n < 0x10000) {
		msd_CE2_16bit(strings, n, depth);
		return;
	}
	assert(n > B);
	static Buckets buckets;
	static std::array<unsigned char*, (256+6)*B> temp_space;
	static FreeBlocks freeblocks;
	BackLinks backlinks(n/B+1);
	std::array<size_t, 256> bucketsize;

	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = 0;
		buckets[i].clear();
	}

	// Initialize our list of free blocks.
	for (size_t i=0; i < 256+6; ++i)
		freeblocks.push_back(&temp_space[i*B]);
	for (size_t i=0; i < n-B; i+=B)
		freeblocks.push_back(&strings[i]);

	// Distribute strings to buckets. Use a small cache to reduce memory
	// stalls. The exact size of the cache is not very important.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			const unsigned char c = cache[j];
			if (bucketsize[c] % B == 0) {
				Block b = take_free_block(freeblocks);
				buckets[c].push_back(b);
				// Backlinks must be set for those blocks, that
				// use the original string array space.
				if (b >= strings && b < strings+n) {
					backlinks[(b-strings)/B] = &(buckets[c].back());
				}
			}
			assert(not buckets[c].empty());
			buckets[c].back()[bucketsize[c] % B] = strings[i+j];
			++bucketsize[c];
		}
	}
	for (; i < n; ++i) {
		const unsigned char c = strings[i][depth];
		if (bucketsize[c] % B == 0) {
			Block b = take_free_block(freeblocks);
			buckets[c].push_back(b);
			if (b >= strings && b < strings+n) {
				backlinks[(b-strings)/B] = &(buckets[c].back());
			}
		}
		assert(not buckets[c].empty());
		buckets[c].back()[bucketsize[c] % B] = strings[i];
		++bucketsize[c];
	}

	// Process each bucket, and copy all strings in that bucket to proper
	// place in the original string pointer array. This means that those
	// positions that are occupied by other blocks must be moved to free
	// space etc.
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;

		Bucket::const_iterator it = buckets[i].begin();
		for (size_t bucket_pos=0; bucket_pos < bucketsize[i]; ++it, bucket_pos+=B) {
			const size_t block_items = std::min(size_t(B), bucketsize[i]-bucket_pos);
			const size_t block_overlap = (pos+block_items-1)/B;

			if (*it == (strings+pos)) {
				assert(pos%B==0);
				backlinks[pos/B] = 0;
				pos += block_items;
				continue;
			}

			// Don't overwrite the block in the position we are
			// about to write to, but copy it into safety.
			if (backlinks[block_overlap]) {
				// Take a free block. The block can be 'stale',
				// i.e. it can point to positions we have
				// already copied new strings into. Take free
				// blocks until we have non-stale block.
				Block tmp = take_free_block(freeblocks);
				while (tmp >= strings && tmp < strings+pos)
					tmp = take_free_block(freeblocks);
				if (tmp >= strings && tmp < strings+n) {
					assert(backlinks[(tmp-strings)/B]==0);
					backlinks[(tmp-strings)/B] = backlinks[block_overlap];
				}
				memcpy(tmp, *(backlinks[block_overlap]), B*sizeof(unsigned char*));
				*(backlinks[block_overlap]) = tmp;
				backlinks[block_overlap] = 0;
			}

			if (*it >= strings && *it < strings+n) {
				assert(*it > strings+pos);
				backlinks[(*it-strings)/B] = 0;
			}

			// Copy string pointers to correct position.
			memcpy(strings+pos, *it, block_items*sizeof(unsigned char*));

			// Return block for later use. Favor those in the
			// temporary space.
			if (*it >= strings && *it < strings+n) {
				freeblocks.push_back(*it);
			} else {
				freeblocks.push_front(*it);
			}

			pos += block_items;
		}
	}
	freeblocks.clear();
	backlinks.clear();
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<B>(strings+pos, bucketsize[i], depth+1);
		pos += bucketsize[i];
	}
}